

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_create_any(lysc_node *schema,void *value,LYD_ANYDATA_VALUETYPE value_type,
                     ly_bool use_value,lyd_node **node)

{
  ly_in *local_58;
  ly_in *in;
  lyd_any_value any_val;
  lyd_node_any *any;
  lyd_node *tree;
  LY_ERR r;
  LY_ERR rc;
  lyd_node **node_local;
  ly_bool use_value_local;
  lyd_node_any *plStack_20;
  LYD_ANYDATA_VALUETYPE value_type_local;
  void *value_local;
  lysc_node *schema_local;
  
  tree._4_4_ = LY_SUCCESS;
  any_val.tree = (lyd_node *)0x0;
  local_58 = (ly_in *)0x0;
  _r = (lyd_any_value *)node;
  node_local._3_1_ = use_value;
  node_local._4_4_ = value_type;
  plStack_20 = (lyd_node_any *)value;
  value_local = schema;
  if ((schema->nodetype & 0x60) == 0) {
    __assert_fail("schema->nodetype & LYD_NODE_ANY",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x140,
                  "LY_ERR lyd_create_any(const struct lysc_node *, const void *, LYD_ANYDATA_VALUETYPE, ly_bool, struct lyd_node **)"
                 );
  }
  any_val.tree = (lyd_node *)calloc(1,0x48);
  if (any_val.tree == (lyd_node *)0x0) {
    ly_log((ly_ctx *)**(undefined8 **)((long)value_local + 8),LY_LLERR,LY_EMEM,
           "Memory allocation failed (%s()).","lyd_create_any");
    return LY_EMEM;
  }
  (any_val.tree)->schema = (lysc_node *)value_local;
  (any_val.tree)->prev = (lyd_node *)any_val;
  (any_val.tree)->flags = 4;
  if (*value_local == 0x60) {
    if (node_local._4_4_ == LYD_ANYDATA_STRING) {
      lyd_create_any_string_valtype(plStack_20,(LYD_ANYDATA_VALUETYPE *)((long)&node_local + 4));
    }
    if (node_local._4_4_ != LYD_ANYDATA_DATATREE) {
      if (plStack_20 == (lyd_node_any *)0x0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                      ,0x152,
                      "LY_ERR lyd_create_any(const struct lysc_node *, const void *, LYD_ANYDATA_VALUETYPE, ly_bool, struct lyd_node **)"
                     );
      }
      tree._4_4_ = ly_in_new_memory((char *)plStack_20,&local_58);
      if (tree._4_4_ != LY_SUCCESS) goto LAB_0013e2c4;
      tree._0_4_ = lyd_create_any_datatree
                             ((ly_ctx *)**(undefined8 **)((long)value_local + 8),local_58,
                              node_local._4_4_,'\x01',(lyd_node **)&any);
      if ((LY_ERR)tree != LY_SUCCESS) {
        ly_log((ly_ctx *)**(undefined8 **)((long)value_local + 8),LY_LLERR,tree._4_4_,
               "Failed to parse any content into a data tree.");
        tree._4_4_ = (LY_ERR)tree;
        goto LAB_0013e2c4;
      }
      if (node_local._3_1_ != '\0') {
        free(plStack_20);
      }
      node_local._3_1_ = '\x01';
      plStack_20 = any;
      node_local._4_4_ = LYD_ANYDATA_DATATREE;
    }
  }
  else if (node_local._4_4_ != LYD_ANYDATA_DATATREE) {
    if (node_local._4_4_ == LYD_ANYDATA_STRING) {
      lyd_create_any_string_valtype(plStack_20,(LYD_ANYDATA_VALUETYPE *)((long)&node_local + 4));
      if ((node_local._4_4_ != LYD_ANYDATA_DATATREE) && (node_local._4_4_ != LYD_ANYDATA_STRING))
      goto LAB_0013e1b2;
    }
    else if (node_local._4_4_ - LYD_ANYDATA_XML < 3) {
LAB_0013e1b2:
      if (plStack_20 != (lyd_node_any *)0x0) {
        tree._4_4_ = ly_in_new_memory((char *)plStack_20,&local_58);
        if (tree._4_4_ != LY_SUCCESS) goto LAB_0013e2c4;
        tree._0_4_ = lyd_create_any_datatree
                               ((ly_ctx *)**(undefined8 **)((long)value_local + 8),local_58,
                                node_local._4_4_,'\0',(lyd_node **)&any);
        if ((LY_ERR)tree == LY_SUCCESS) {
          if (node_local._3_1_ != '\0') {
            free(plStack_20);
          }
          node_local._3_1_ = '\x01';
          plStack_20 = any;
          node_local._4_4_ = LYD_ANYDATA_DATATREE;
        }
      }
    }
  }
  if (node_local._3_1_ == '\0') {
    in = (ly_in *)plStack_20;
    tree._4_4_ = lyd_any_copy_value(any_val.tree,(lyd_any_value *)&in,node_local._4_4_);
    if (tree._4_4_ != LY_SUCCESS) goto LAB_0013e2c4;
  }
  else {
    if (node_local._4_4_ == LYD_ANYDATA_DATATREE) {
      *(lyd_node_any **)(any_val.tree + 1) = plStack_20;
    }
    else if (node_local._4_4_ - LYD_ANYDATA_STRING < 3) {
      tree._4_4_ = lydict_insert_zc((ly_ctx *)**(undefined8 **)((long)value_local + 8),
                                    (char *)plStack_20,(char **)(any_val.tree + 1));
      if (tree._4_4_ != LY_SUCCESS) goto LAB_0013e2c4;
    }
    else if (node_local._4_4_ == LYD_ANYDATA_LYB) {
      *(lyd_node_any **)(any_val.tree + 1) = plStack_20;
    }
    *(LYD_ANYDATA_VALUETYPE *)&any_val.tree[1].schema = node_local._4_4_;
  }
  lyd_hash(any_val.tree);
LAB_0013e2c4:
  if (tree._4_4_ == LY_SUCCESS) {
    *_r = any_val;
  }
  else {
    lyd_free_tree(any_val.tree);
  }
  ly_in_free(local_58,'\0');
  return tree._4_4_;
}

Assistant:

LY_ERR
lyd_create_any(const struct lysc_node *schema, const void *value, LYD_ANYDATA_VALUETYPE value_type, ly_bool use_value,
        struct lyd_node **node)
{
    LY_ERR rc = LY_SUCCESS, r;
    struct lyd_node *tree;
    struct lyd_node_any *any = NULL;
    union lyd_any_value any_val;
    struct ly_in *in = NULL;

    assert(schema->nodetype & LYD_NODE_ANY);

    any = calloc(1, sizeof *any);
    LY_CHECK_ERR_RET(!any, LOGMEM(schema->module->ctx), LY_EMEM);

    any->schema = schema;
    any->prev = &any->node;
    any->flags = LYD_NEW;

    if (schema->nodetype == LYS_ANYDATA) {
        /* anydata */
        if (value_type == LYD_ANYDATA_STRING) {
            /* detect value type */
            lyd_create_any_string_valtype(value, &value_type);
        }

        if (value_type != LYD_ANYDATA_DATATREE) {
            /* create input */
            assert(value);
            LY_CHECK_GOTO(rc = ly_in_new_memory(value, &in), cleanup);

            /* parse as a data tree */
            if ((r = lyd_create_any_datatree(schema->module->ctx, in, value_type, 1, &tree))) {
                LOGERR(schema->module->ctx, rc, "Failed to parse any content into a data tree.");
                rc = r;
                goto cleanup;
            }

            /* use the parsed data tree */
            if (use_value) {
                free((void *)value);
            }
            use_value = 1;
            value = tree;
            value_type = LYD_ANYDATA_DATATREE;
        }
    } else {
        /* anyxml */
        switch (value_type) {
        case LYD_ANYDATA_DATATREE:
            /* fine, just use the value */
            break;
        case LYD_ANYDATA_STRING:
            /* detect value type */
            lyd_create_any_string_valtype(value, &value_type);
            if ((value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_STRING)) {
                break;
            }
        /* fallthrough */
        case LYD_ANYDATA_XML:
        case LYD_ANYDATA_JSON:
        case LYD_ANYDATA_LYB:
            if (!value) {
                /* nothing to parse */
                break;
            }

            /* create input */
            LY_CHECK_GOTO(rc = ly_in_new_memory(value, &in), cleanup);

            /* try to parse as a data tree */
            r = lyd_create_any_datatree(schema->module->ctx, in, value_type, 0, &tree);
            if (!r) {
                /* use the parsed data tree */
                if (use_value) {
                    free((void *)value);
                }
                use_value = 1;
                value = tree;
                value_type = LYD_ANYDATA_DATATREE;
            }
            break;
        }
    }

    if (use_value) {
        switch (value_type) {
        case LYD_ANYDATA_DATATREE:
            any->value.tree = (void *)value;
            break;
        case LYD_ANYDATA_STRING:
        case LYD_ANYDATA_XML:
        case LYD_ANYDATA_JSON:
            LY_CHECK_GOTO(rc = lydict_insert_zc(schema->module->ctx, (void *)value, &any->value.str), cleanup);
            break;
        case LYD_ANYDATA_LYB:
            any->value.mem = (void *)value;
            break;
        }
        any->value_type = value_type;
    } else {
        any_val.str = value;
        LY_CHECK_GOTO(rc = lyd_any_copy_value(&any->node, &any_val, value_type), cleanup);
    }
    lyd_hash(&any->node);

cleanup:
    if (rc) {
        lyd_free_tree(&any->node);
    } else {
        *node = &any->node;
    }
    ly_in_free(in, 0);
    return rc;
}